

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

float lda_loop(lda *l,v_array<float> *Elogtheta,float *v,example *ec,float param_5)

{
  float fVar1;
  float fVar2;
  void *__dest;
  bool bVar3;
  size_t sVar4;
  float **ppfVar5;
  features_value_index_iterator *this;
  feature_value *pfVar6;
  float *pfVar7;
  long in_RCX;
  int __c;
  void *in_RDX;
  features_value_iterator *rhs;
  ulong *in_RDI;
  float fVar8;
  double dVar9;
  size_t k_1;
  size_t k;
  size_t max_k;
  size_t in_stack_00000078;
  float c_w;
  float *u_for_w;
  iterator *f;
  iterator __end3;
  iterator __begin3;
  features *__range3;
  features *fs_1;
  iterator __end2;
  iterator __begin2;
  example *__range2;
  size_t word_count;
  float doc_length;
  float score;
  float xc_w;
  features *fs;
  iterator __end1;
  iterator __begin1;
  example *__range1;
  size_t num_words;
  size_t i;
  parameters *weights;
  float *in_stack_fffffffffffffe88;
  example_predict *in_stack_fffffffffffffe90;
  parameters *in_stack_fffffffffffffe98;
  vw *in_stack_fffffffffffffea0;
  features *in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffec0;
  weight in_stack_fffffffffffffec4;
  vw *in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffed0;
  feature_value in_stack_fffffffffffffed4;
  ulong local_118;
  v_array<float> *in_stack_fffffffffffffef0;
  v_array<float> *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  weight *local_f8;
  features_value_iterator local_e8 [2];
  features_value_index_iterator local_d8;
  features *local_c8;
  features *local_c0;
  iterator local_b8;
  iterator local_a8;
  long local_98;
  long local_90;
  float local_84;
  float local_80;
  float local_7c;
  features *local_78;
  iterator local_70;
  iterator local_60;
  long local_50;
  long local_48;
  undefined4 local_40;
  undefined4 local_3c;
  ulong local_38;
  vw *local_30;
  long local_20;
  void *local_18;
  ulong *local_8;
  
  local_30 = (vw *)(in_RDI[0x31] + 0x3590);
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  v_array<float>::clear((v_array<float> *)in_stack_fffffffffffffe90);
  v_array<float>::clear((v_array<float> *)in_stack_fffffffffffffe90);
  for (local_38 = 0; local_38 < *local_8; local_38 = local_38 + 1) {
    local_3c = 0x3f800000;
    v_array<float>::push_back((v_array<float> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88)
    ;
    local_40 = 0;
    v_array<float>::push_back((v_array<float> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88)
    ;
  }
  local_48 = 0;
  local_50 = local_20;
  local_60 = example_predict::begin(in_stack_fffffffffffffe90);
  local_70 = example_predict::end(in_stack_fffffffffffffe90);
  while( true ) {
    bVar3 = example_predict::iterator::operator!=(&local_60,&local_70);
    if (!bVar3) break;
    local_78 = example_predict::iterator::operator*(&local_60);
    sVar4 = features::size((features *)0x222214);
    local_48 = sVar4 + local_48;
    example_predict::iterator::operator++(&local_60);
  }
  local_7c = 0.0;
  local_80 = 0.0;
  local_84 = 0.0;
  do {
    __dest = local_18;
    ppfVar5 = v_array<float>::begin((v_array<float> *)(anonymous_namespace)::new_gamma);
    memcpy(__dest,*ppfVar5,*local_8 << 2);
    lda::expdigammify((lda *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      in_stack_fffffffffffffec8,
                      (float *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    ppfVar5 = v_array<float>::begin((v_array<float> *)(anonymous_namespace)::old_gamma);
    pfVar7 = *ppfVar5;
    ppfVar5 = v_array<float>::begin((v_array<float> *)(anonymous_namespace)::new_gamma);
    memcpy(pfVar7,*ppfVar5,*local_8 << 2);
    ppfVar5 = v_array<float>::begin((v_array<float> *)(anonymous_namespace)::new_gamma);
    memset(*ppfVar5,0,*local_8 << 2);
    local_80 = 0.0;
    local_90 = 0;
    local_84 = 0.0;
    local_98 = local_20;
    local_a8 = example_predict::begin(in_stack_fffffffffffffe90);
    local_b8 = example_predict::end(in_stack_fffffffffffffe90);
    while( true ) {
      bVar3 = example_predict::iterator::operator!=(&local_a8,&local_b8);
      if (!bVar3) break;
      local_c8 = example_predict::iterator::operator*(&local_a8);
      local_c0 = local_c8;
      features::begin(in_stack_fffffffffffffea8);
      features::end(in_stack_fffffffffffffea8);
      while( true ) {
        rhs = local_e8;
        bVar3 = features_value_iterator::operator!=(&local_d8.super_features_value_iterator,rhs);
        if (!bVar3) break;
        this = features_value_index_iterator::operator*(&local_d8);
        in_stack_fffffffffffffec8 = local_30;
        features_value_index_iterator::index(this,(char *)rhs,__c);
        local_f8 = parameters::operator[]
                             (in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90);
        local_f8 = local_f8 + *local_8;
        in_stack_fffffffffffffed0 =
             find_cw((lda *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,(float *)0x222481);
        in_stack_ffffffffffffff04 = in_stack_fffffffffffffed0;
        pfVar6 = features_value_iterator::value(&this->super_features_value_iterator);
        local_7c = in_stack_fffffffffffffed0 * *pfVar6;
        pfVar6 = features_value_iterator::value(&this->super_features_value_iterator);
        in_stack_fffffffffffffed4 = -*pfVar6;
        dVar9 = std::log((double)(ulong)(uint)in_stack_ffffffffffffff04);
        local_80 = in_stack_fffffffffffffed4 * SUB84(dVar9,0) + local_80;
        in_stack_fffffffffffffef8 = (v_array<float> *)*local_8;
        for (in_stack_fffffffffffffef0 = (v_array<float> *)0x0; local_f8 = local_f8 + 1,
            in_stack_fffffffffffffef0 < in_stack_fffffffffffffef8;
            in_stack_fffffffffffffef0 =
                 (v_array<float> *)((long)&in_stack_fffffffffffffef0->_begin + 1)) {
          in_stack_fffffffffffffec4 = *local_f8;
          in_stack_fffffffffffffec0 = local_7c;
          pfVar7 = v_array<float>::operator[]
                             ((v_array<float> *)(anonymous_namespace)::new_gamma,
                              (size_t)in_stack_fffffffffffffef0);
          *pfVar7 = in_stack_fffffffffffffec0 * in_stack_fffffffffffffec4 + *pfVar7;
        }
        local_90 = local_90 + 1;
        pfVar6 = features_value_iterator::value(&this->super_features_value_iterator);
        local_84 = *pfVar6 + local_84;
        features_value_index_iterator::operator++
                  ((features_value_index_iterator *)in_stack_fffffffffffffe90);
      }
      example_predict::iterator::operator++(&local_a8);
    }
    for (local_118 = 0; local_118 < *local_8; local_118 = local_118 + 1) {
      pfVar7 = v_array<float>::operator[]
                         ((v_array<float> *)(anonymous_namespace)::new_gamma,local_118);
      fVar8 = *pfVar7;
      fVar1 = *(float *)((long)local_18 + local_118 * 4);
      fVar2 = *(float *)(local_8 + 1);
      pfVar7 = v_array<float>::operator[]
                         ((v_array<float> *)(anonymous_namespace)::new_gamma,local_118);
      *pfVar7 = fVar8 * fVar1 + fVar2;
    }
    in_stack_fffffffffffffea8 = (features *)local_8[0x31];
    v_array<float>::begin((v_array<float> *)(anonymous_namespace)::old_gamma);
    v_array<float>::begin((v_array<float> *)(anonymous_namespace)::new_gamma);
    fVar8 = average_diff(in_stack_fffffffffffffea0,(float *)in_stack_fffffffffffffe98,
                         (float *)in_stack_fffffffffffffe90);
  } while (*(float *)((long)local_8 + 0x14) <= fVar8 && fVar8 != *(float *)((long)local_8 + 0x14));
  v_array<float>::clear((v_array<float> *)in_stack_fffffffffffffe90);
  v_array<float>::resize((v_array<float> *)u_for_w,in_stack_00000078);
  ppfVar5 = v_array<float>::begin((v_array<float> *)(local_20 + 0x6850));
  pfVar7 = *ppfVar5;
  ppfVar5 = v_array<float>::begin((v_array<float> *)(anonymous_namespace)::new_gamma);
  memcpy(pfVar7,*ppfVar5,*local_8 << 2);
  ppfVar5 = v_array<float>::begin((v_array<float> *)(local_20 + 0x6850));
  pfVar7 = *ppfVar5 + *local_8;
  ppfVar5 = v_array<float>::end((v_array<float> *)(local_20 + 0x6850));
  *ppfVar5 = pfVar7;
  v_array<float>::begin((v_array<float> *)(anonymous_namespace)::new_gamma);
  fVar8 = theta_kl((lda *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffef8,(float *)in_stack_fffffffffffffef0);
  return (fVar8 + local_80) / local_84;
}

Assistant:

float lda_loop(lda &l, v_array<float> &Elogtheta, float *v, example *ec, float)
{
  parameters &weights = l.all->weights;
  new_gamma.clear();
  old_gamma.clear();

  for (size_t i = 0; i < l.topics; i++)
  {
    new_gamma.push_back(1.f);
    old_gamma.push_back(0.f);
  }
  size_t num_words = 0;
  for (features &fs : *ec) num_words += fs.size();

  float xc_w = 0;
  float score = 0;
  float doc_length = 0;
  do
  {
    memcpy(v, new_gamma.begin(), sizeof(float) * l.topics);
    l.expdigammify(*l.all, v);

    memcpy(old_gamma.begin(), new_gamma.begin(), sizeof(float) * l.topics);
    memset(new_gamma.begin(), 0, sizeof(float) * l.topics);

    score = 0;
    size_t word_count = 0;
    doc_length = 0;
    for (features &fs : *ec)
    {
      for (features::iterator &f : fs)
      {
        float *u_for_w = &(weights[f.index()]) + l.topics + 1;
        float c_w = find_cw(l, u_for_w, v);
        xc_w = c_w * f.value();
        score += -f.value() * log(c_w);
        size_t max_k = l.topics;
        for (size_t k = 0; k < max_k; k++, ++u_for_w) new_gamma[k] += xc_w * *u_for_w;
        word_count++;
        doc_length += f.value();
      }
    }
    for (size_t k = 0; k < l.topics; k++) new_gamma[k] = new_gamma[k] * v[k] + l.lda_alpha;
  } while (average_diff(*l.all, old_gamma.begin(), new_gamma.begin()) > l.lda_epsilon);

  ec->pred.scalars.clear();
  ec->pred.scalars.resize(l.topics);
  memcpy(ec->pred.scalars.begin(), new_gamma.begin(), l.topics * sizeof(float));
  ec->pred.scalars.end() = ec->pred.scalars.begin() + l.topics;

  score += theta_kl(l, Elogtheta, new_gamma.begin());

  return score / doc_length;
}